

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

bool __thiscall spvtools::opt::SENode::operator==(SENode *this,SENode *other)

{
  value_type pSVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ChildContainerType *pCVar6;
  size_type sVar7;
  size_type sVar8;
  undefined4 extraout_var;
  SERecurrentNode *pSVar9;
  const_reference ppSVar10;
  SERecurrentNode *this_00;
  SENode *pSVar11;
  SENode *pSVar12;
  Loop *pLVar13;
  Loop *pLVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int64_t iVar15;
  undefined4 extraout_var_05;
  int64_t iVar16;
  SERecurrentNode *other_as_recurrent;
  size_t index;
  SERecurrentNode *this_as_recurrent;
  SENode *other_local;
  SENode *this_local;
  undefined4 extraout_var_00;
  
  iVar2 = (**this->_vptr_SENode)();
  iVar3 = (**other->_vptr_SENode)();
  if (iVar2 == iVar3) {
    pCVar6 = GetChildren(other);
    sVar7 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                      (pCVar6);
    sVar8 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                      (&this->children_);
    if (sVar7 == sVar8) {
      iVar2 = (*this->_vptr_SENode[7])();
      pSVar9 = (SERecurrentNode *)CONCAT44(extraout_var,iVar2);
      if (pSVar9 == (SERecurrentNode *)0x0) {
        for (other_as_recurrent = (SERecurrentNode *)0x0;
            pSVar9 = (SERecurrentNode *)
                     std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ::size(&this->children_), other_as_recurrent < pSVar9;
            other_as_recurrent =
                 (SERecurrentNode *)((long)&(other_as_recurrent->super_SENode)._vptr_SENode + 1)) {
          pCVar6 = GetChildren(other);
          ppSVar10 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ::operator[](pCVar6,(size_type)other_as_recurrent);
          pSVar1 = *ppSVar10;
          ppSVar10 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ::operator[](&this->children_,(size_type)other_as_recurrent);
          if (pSVar1 != *ppSVar10) {
            return false;
          }
        }
      }
      else {
        iVar2 = (*other->_vptr_SENode[7])();
        this_00 = (SERecurrentNode *)CONCAT44(extraout_var_00,iVar2);
        if (this_00 == (SERecurrentNode *)0x0) {
          __assert_fail("other_as_recurrent",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                        ,0x204,"bool spvtools::opt::SENode::operator==(const SENode &) const");
        }
        pSVar11 = SERecurrentNode::GetCoefficient(pSVar9);
        pSVar12 = SERecurrentNode::GetCoefficient(this_00);
        if (pSVar11 != pSVar12) {
          return false;
        }
        pSVar11 = SERecurrentNode::GetOffset(pSVar9);
        pSVar12 = SERecurrentNode::GetOffset(this_00);
        if (pSVar11 != pSVar12) {
          return false;
        }
        pLVar13 = SERecurrentNode::GetLoop(pSVar9);
        pLVar14 = SERecurrentNode::GetLoop(this_00);
        if (pLVar13 != pLVar14) {
          return false;
        }
      }
      iVar2 = (**this->_vptr_SENode)();
      if (iVar2 == 5) {
        iVar2 = (*this->_vptr_SENode[0xf])();
        uVar4 = SEValueUnknown::ResultId((SEValueUnknown *)CONCAT44(extraout_var_01,iVar2));
        iVar2 = (*other->_vptr_SENode[0xf])();
        uVar5 = SEValueUnknown::ResultId((SEValueUnknown *)CONCAT44(extraout_var_02,iVar2));
        if (uVar4 != uVar5) {
          return false;
        }
      }
      iVar2 = (*this->_vptr_SENode[5])();
      if (CONCAT44(extraout_var_03,iVar2) != 0) {
        iVar2 = (*this->_vptr_SENode[5])();
        iVar15 = SEConstantNode::FoldToSingleValue
                           ((SEConstantNode *)CONCAT44(extraout_var_04,iVar2));
        iVar2 = (*other->_vptr_SENode[5])();
        iVar16 = SEConstantNode::FoldToSingleValue
                           ((SEConstantNode *)CONCAT44(extraout_var_05,iVar2));
        if (iVar15 != iVar16) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SENode::operator==(const SENode& other) const {
  if (GetType() != other.GetType()) return false;

  if (other.GetChildren().size() != children_.size()) return false;

  const SERecurrentNode* this_as_recurrent = AsSERecurrentNode();

  // Check the children are the same, for SERecurrentNodes we need to check the
  // offset and coefficient manually as the child vector is sorted by ids so the
  // offset/coefficient information is lost.
  if (!this_as_recurrent) {
    for (size_t index = 0; index < children_.size(); ++index) {
      if (other.GetChildren()[index] != children_[index]) return false;
    }
  } else {
    const SERecurrentNode* other_as_recurrent = other.AsSERecurrentNode();

    // We've already checked the types are the same, this should not fail if
    // this->AsSERecurrentNode() succeeded.
    assert(other_as_recurrent);

    if (this_as_recurrent->GetCoefficient() !=
        other_as_recurrent->GetCoefficient())
      return false;

    if (this_as_recurrent->GetOffset() != other_as_recurrent->GetOffset())
      return false;

    if (this_as_recurrent->GetLoop() != other_as_recurrent->GetLoop())
      return false;
  }

  // If we're dealing with a value unknown node check both nodes were created by
  // the same instruction.
  if (GetType() == SENode::ValueUnknown) {
    if (AsSEValueUnknown()->ResultId() !=
        other.AsSEValueUnknown()->ResultId()) {
      return false;
    }
  }

  if (AsSEConstantNode()) {
    if (AsSEConstantNode()->FoldToSingleValue() !=
        other.AsSEConstantNode()->FoldToSingleValue())
      return false;
  }

  return true;
}